

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O0

void __thiscall mocker::ast::CompoundStmt::~CompoundStmt(CompoundStmt *this)

{
  CompoundStmt *this_local;
  
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__CompoundStmt_0039e368;
  std::
  vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
  ::~vector(&this->stmts);
  Statement::~Statement(&this->super_Statement);
  return;
}

Assistant:

explicit CompoundStmt(std::vector<std::shared_ptr<Statement>> stmts)
      : stmts(std::move(stmts)) {}